

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

int read_subject_to(string_view buf_1,string_view buf_2,string_view buf_3)

{
  string_view lhs;
  string_view lhs_00;
  string_view lhs_01;
  string_view lhs_02;
  string_view lhs_03;
  string_view lhs_04;
  string_view lhs_05;
  string_view lhs_06;
  string_view lhs_07;
  string_view lhs_08;
  string_view lhs_09;
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  size_t sVar4;
  string_view local_1a0;
  size_t local_190;
  char *local_188;
  string_view local_180;
  char *local_170;
  char *local_168;
  string_view local_160;
  size_t local_150;
  char *local_148;
  string_view local_140;
  size_t local_130;
  char *local_128;
  string_view local_120;
  char *local_110;
  char *local_108;
  string_view local_100;
  size_t local_f0;
  char *local_e8;
  string_view local_e0;
  char *local_d0;
  char *local_c8;
  string_view local_c0;
  size_t local_b0;
  char *local_a8;
  string_view local_a0;
  size_t local_90;
  char *local_88;
  string_view local_80;
  size_t local_70;
  char *local_68;
  string_view local_60;
  size_t local_50;
  char *local_48;
  size_t local_40;
  string_view buf_3_local;
  string_view buf_2_local;
  string_view buf_1_local;
  
  pcVar3 = buf_1._M_str;
  sVar4 = buf_1._M_len;
  pcVar2 = buf_2._M_str;
  buf_3_local._M_str = (char *)buf_2._M_len;
  buf_3_local._M_len = (size_t)buf_3._M_str;
  local_40 = buf_3._M_len;
  local_50 = sVar4;
  local_48 = pcVar3;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_60,"st");
  lhs_09._M_str = local_48;
  lhs_09._M_len = local_50;
  bVar1 = are_equal(lhs_09,local_60);
  if (!bVar1) {
    local_70 = sVar4;
    local_68 = pcVar3;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_80,"st.");
    lhs_08._M_str = local_68;
    lhs_08._M_len = local_70;
    bVar1 = are_equal(lhs_08,local_80);
    if (!bVar1) {
      local_90 = sVar4;
      local_88 = pcVar3;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a0,"s.t");
      lhs_07._M_str = local_88;
      lhs_07._M_len = local_90;
      bVar1 = are_equal(lhs_07,local_a0);
      if (!bVar1) {
        local_b0 = sVar4;
        local_a8 = pcVar3;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_c0,"s.t.");
        lhs_06._M_str = local_a8;
        lhs_06._M_len = local_b0;
        bVar1 = are_equal(lhs_06,local_c0);
        if (!bVar1) {
          local_f0 = sVar4;
          local_e8 = pcVar3;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_100,"subject");
          lhs_04._M_str = local_e8;
          lhs_04._M_len = local_f0;
          bVar1 = are_equal(lhs_04,local_100);
          if (bVar1) {
            local_110 = buf_3_local._M_str;
            local_108 = pcVar2;
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_120,"to");
            lhs_03._M_str = local_108;
            lhs_03._M_len = (size_t)local_110;
            bVar1 = are_equal(lhs_03,local_120);
            if (bVar1) {
              local_130 = local_40;
              local_128 = (char *)buf_3_local._M_len;
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (&local_140,":");
              lhs_02._M_str = local_128;
              lhs_02._M_len = local_130;
              bVar1 = are_equal(lhs_02,local_140);
              if (!bVar1) {
                return 2;
              }
              return 3;
            }
          }
          local_150 = sVar4;
          local_148 = pcVar3;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_160,"sush");
          lhs_01._M_str = local_148;
          lhs_01._M_len = local_150;
          bVar1 = are_equal(lhs_01,local_160);
          if (bVar1) {
            local_170 = buf_3_local._M_str;
            local_168 = pcVar2;
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_180,"that");
            lhs_00._M_str = local_168;
            lhs_00._M_len = (size_t)local_170;
            bVar1 = are_equal(lhs_00,local_180);
            if (bVar1) {
              local_190 = local_40;
              local_188 = (char *)buf_3_local._M_len;
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (&local_1a0,":");
              lhs._M_str = local_188;
              lhs._M_len = local_190;
              bVar1 = are_equal(lhs,local_1a0);
              if (!bVar1) {
                return 2;
              }
              return 3;
            }
          }
          return 0;
        }
      }
    }
  }
  local_d0 = buf_3_local._M_str;
  local_c8 = pcVar2;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_e0,":");
  lhs_05._M_str = local_c8;
  lhs_05._M_len = (size_t)local_d0;
  bVar1 = are_equal(lhs_05,local_e0);
  buf_1_local._M_str._4_4_ = 1;
  if (bVar1) {
    buf_1_local._M_str._4_4_ = 2;
  }
  return buf_1_local._M_str._4_4_;
}

Assistant:

constexpr int
read_subject_to(const std::string_view buf_1,
                const std::string_view buf_2,
                const std::string_view buf_3) noexcept
{
    if (are_equal(buf_1, "st") || are_equal(buf_1, "st.") ||
        are_equal(buf_1, "s.t") || are_equal(buf_1, "s.t."))
        return are_equal(buf_2, ":") ? 2 : 1;

    if (are_equal(buf_1, "subject"))
        if (are_equal(buf_2, "to"))
            return are_equal(buf_3, ":") ? 3 : 2;

    if (are_equal(buf_1, "sush"))
        if (are_equal(buf_2, "that"))
            return are_equal(buf_3, ":") ? 3 : 2;

    return 0;
}